

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalSubscriptMat3(ShaderEvalContext *c)

{
  VecAccess<float,_4,_3> local_80;
  undefined1 local_64 [12];
  Vector<float,_3> local_58;
  undefined1 local_4c [12];
  Vector<float,_3> local_40;
  undefined1 local_34 [12];
  Vector<float,_3> local_28;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_34,(int)c,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_4c,(int)local_10,1,2);
  tcu::operator*((tcu *)&local_40,0.5,(Vector<float,_3> *)local_4c);
  tcu::operator+((tcu *)&local_28,(Vector<float,_3> *)local_34,&local_40);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_64,(int)local_10,2,3);
  tcu::operator*((tcu *)&local_58,0.25,(Vector<float,_3> *)local_64);
  tcu::operator+((tcu *)&local_1c,&local_28,&local_58);
  tcu::Vector<float,_4>::xyz(&local_80,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_80,&local_1c);
  return;
}

Assistant:

void evalSubscriptMat3		(ShaderEvalContext& c) { c.color.xyz()	= c.coords.swizzle(0,1,2) + 0.5f*c.coords.swizzle(1,2,3) + 0.25f*c.coords.swizzle(2,3,0); }